

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  uint uVar2;
  ffe_t fVar3;
  ffe_t *pfVar4;
  uint i;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint i_3;
  uint uVar8;
  ffe_t *pfVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ushort local_58 [20];
  
  uVar8 = 1;
  for (iVar5 = 0; iVar5 != 0xffff; iVar5 = iVar5 + 1) {
    uVar2 = uVar8 * 2;
    GFExp[uVar8] = (ffe_t)iVar5;
    uVar8 = uVar2;
    if (0xffff < uVar2) {
      uVar8 = uVar2 ^ 0x1002d;
    }
  }
  GFExp[0] = 0xffff;
  GFLog[0] = 0;
  pfVar9 = kGFBasis;
  lVar13 = 1;
  pfVar4 = GFLog;
  for (uVar6 = 0; uVar6 != 0x10; uVar6 = uVar6 + 1) {
    uVar1 = kGFBasis[uVar6];
    lVar7 = (1L << (uVar6 & 0x3f) & 0xffffffffU) * 2;
    for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 2) {
      *(ushort *)((long)GFLog + lVar7 + lVar11) = *(ushort *)((long)GFLog + lVar11) ^ uVar1;
    }
  }
  for (lVar7 = 0; lVar7 != 0x20000; lVar7 = lVar7 + 2) {
    pfVar9 = (ffe_t *)(ulong)GFExp[*(ushort *)((long)GFLog + lVar7)];
    *(ffe_t *)((long)GFLog + lVar7) = GFExp[*(ushort *)((long)GFLog + lVar7)];
  }
  for (lVar7 = 0; lVar7 != 0x10000; lVar7 = lVar7 + 1) {
    pfVar9 = (ffe_t *)(ulong)*pfVar4;
    pfVar4 = pfVar4 + 1;
    GFExp[(long)pfVar9] = (ffe_t)lVar7;
  }
  GFExp[0xffff] = GFExp[0];
  lVar7 = 0;
  while (lVar7 != 0xf) {
    uVar8 = 1 << ((uint)(lVar7 + 1) & 0x1f);
    pfVar9 = (ffe_t *)(ulong)uVar8;
    local_58[lVar7] = (ushort)uVar8;
    lVar7 = lVar7 + 1;
  }
  for (lVar7 = 0; lVar7 != 0xf; lVar7 = lVar7 + 1) {
    uVar6 = (ulong)(uint)~(-1 << ((uint)lVar7 & 0x1f));
    skewVec[uVar6] = 0;
    for (lVar11 = lVar7; lVar11 != 0xf; lVar11 = lVar11 + 1) {
      uVar10 = (ulong)(uint)(2 << ((uint)lVar11 & 0x1f));
      for (lVar12 = 0; uVar6 + lVar12 < uVar10;
          lVar12 = lVar12 + (ulong)(uint)(2 << ((uint)lVar7 & 0x1f))) {
        skewVec[lVar12 + uVar6 + uVar10] = local_58[lVar11] ^ skewVec[lVar12 + uVar6];
      }
    }
    pfVar9 = (ffe_t *)(ulong)GFLog[local_58[lVar7] ^ 1];
    fVar3 = mulE(local_58[lVar7],GFLog[local_58[lVar7] ^ 1]);
    local_58[lVar7] = ~GFLog[fVar3];
    for (lVar11 = lVar13; lVar11 != 0xf; lVar11 = lVar11 + 1) {
      uVar8 = ((uint)local_58[lVar7] + (uint)GFLog[local_58[lVar11] ^ 1] >> 0x10) +
              (uint)local_58[lVar7] + (uint)GFLog[local_58[lVar11] ^ 1];
      pfVar9 = (ffe_t *)(ulong)(uVar8 & 0xffff);
      fVar3 = mulE(local_58[lVar11],(ffe_t)uVar8);
      local_58[lVar11] = fVar3;
    }
    lVar13 = lVar13 + 1;
  }
  for (lVar13 = 0; lVar13 != 0x20000; lVar13 = lVar13 + 2) {
    *(ffe_t *)((long)skewVec + lVar13) = GFLog[*(ushort *)((long)skewVec + lVar13)];
  }
  for (lVar13 = 0; lVar13 != 0x20000; lVar13 = lVar13 + 2) {
    *(undefined2 *)((long)log_walsh + lVar13) = *(undefined2 *)((long)GFLog + lVar13);
  }
  log_walsh[0] = 0;
  FWHT(log_walsh,(uint)pfVar9);
  uVar6 = time((time_t *)0x0);
  do {
    test(0x8000,0x8000,(uint)uVar6);
    uVar6 = (ulong)((uint)uVar6 + 1);
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    // Fill GFLog table and GFExp table
    InitField();

    // Compute factors used in erasure decoder
    InitFieldOperations();

    unsigned seed = (unsigned)time(NULL);
    for (;;)
    {
#ifdef LEO_SHORT_FIELD
        const unsigned input_count = 32;
        const unsigned recovery_count = 16;
#else // LEO_SHORT_FIELD
        const unsigned input_count = 32768;
        const unsigned recovery_count = 32768;
#endif // LEO_SHORT_FIELD

        test(input_count, recovery_count, seed);

        ++seed;
    }

    return 0;
}